

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O3

void __thiscall
btMultiBodyJointLimitConstraint::createConstraintRows
          (btMultiBodyJointLimitConstraint *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btScalar *pbVar1;
  btMultiBodySolverConstraint *solverConstraint;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  eFeatherstoneJointType eVar5;
  btMultibodyLink *pbVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  void *pvVar13;
  float *pfVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  btScalar bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btScalar bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  btQuaternion q;
  btVector3 local_48;
  
  if ((this->super_btMultiBodyConstraint).m_numDofsFinalized !=
      (this->super_btMultiBodyConstraint).m_jacSizeBoth) {
    (*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this);
  }
  bVar22 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  (this->super_btMultiBodyConstraint).m_data.m_data[(this->super_btMultiBodyConstraint).m_posOffset]
       = bVar22 - this->m_lowerBound;
  fVar23 = this->m_upperBound;
  bVar22 = btMultiBody::getJointPos
                     ((this->super_btMultiBodyConstraint).m_bodyA,
                      (this->super_btMultiBodyConstraint).m_linkA);
  pfVar14 = (this->super_btMultiBodyConstraint).m_data.m_data;
  pfVar14[(long)(this->super_btMultiBodyConstraint).m_posOffset + 1] = fVar23 - bVar22;
  iVar15 = (this->super_btMultiBodyConstraint).m_numRows;
  if (0 < iVar15) {
    iVar20 = 0;
    do {
      uVar4 = *(uint *)(constraintRows + 4);
      uVar16 = uVar4;
      if (uVar4 == *(uint *)(constraintRows + 8)) {
        iVar19 = uVar4 * 2;
        if (uVar4 == 0) {
          iVar19 = 1;
        }
        if ((int)uVar4 < iVar19) {
          if (iVar19 == 0) {
            pvVar13 = (void *)0x0;
          }
          else {
            pvVar13 = btAlignedAllocInternal((long)iVar19 * 0xe0,0x10);
            uVar16 = *(uint *)(constraintRows + 4);
          }
          if (0 < (int)uVar16) {
            lVar18 = 0;
            do {
              memcpy((void *)(lVar18 + (long)pvVar13),
                     (void *)(*(long *)(constraintRows + 0x10) + lVar18),0xe0);
              lVar18 = lVar18 + 0xe0;
            } while ((ulong)uVar16 * 0xe0 - lVar18 != 0);
          }
          if ((*(void **)(constraintRows + 0x10) != (void *)0x0) &&
             (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1)) {
            btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
          }
          constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
          *(void **)(constraintRows + 0x10) = pvVar13;
          *(int *)(constraintRows + 8) = iVar19;
          iVar15 = (this->super_btMultiBodyConstraint).m_numRows;
          pfVar14 = (this->super_btMultiBodyConstraint).m_data.m_data;
          uVar16 = *(uint *)(constraintRows + 4);
        }
      }
      fVar23 = (float)(int)(-(uint)(iVar20 != 0) | 1);
      *(uint *)(constraintRows + 4) = uVar16 + 1;
      lVar18 = *(long *)(constraintRows + 0x10);
      lVar17 = (long)(int)uVar4 * 0xe0;
      solverConstraint = (btMultiBodySolverConstraint *)(lVar18 + lVar17);
      *(btMultiBodyJointLimitConstraint **)(lVar18 + 0xd0 + lVar17) = this;
      *(int *)(lVar18 + 0xd8 + lVar17) = iVar20;
      *(btMultiBody **)(lVar18 + 0xb0 + lVar17) = (this->super_btMultiBodyConstraint).m_bodyA;
      *(btMultiBody **)(lVar18 + 0xc0 + lVar17) = (this->super_btMultiBodyConstraint).m_bodyB;
      local_48.m_floats[0] = 0.0;
      local_48.m_floats[1] = 0.0;
      local_48.m_floats[2] = 0.0;
      local_48.m_floats[3] = 0.0;
      lVar18 = (long)((this->super_btMultiBodyConstraint).m_jacSizeBoth * iVar20 + iVar15);
      bVar22 = btMultiBodyConstraint::fillMultiBodyConstraint
                         (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar14 + lVar18,
                          pfVar14 + (this->super_btMultiBodyConstraint).m_jacSizeA + lVar18,
                          &local_48,&local_48,&local_48,0.0,infoGlobal,0.0,
                          (this->super_btMultiBodyConstraint).m_maxAppliedImpulse,1.0,false,0.0,0.0)
      ;
      iVar15 = (this->super_btMultiBodyConstraint).m_linkA;
      pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
      eVar5 = pbVar6[iVar15].m_jointType;
      if (eVar5 == ePrismatic) {
        btMatrix3x3::getRotation(&pbVar6[iVar15].m_cachedWorldTransform.m_basis,&q);
        fVar24 = q.super_btQuadWord.m_floats[2];
        fVar25 = q.super_btQuadWord.m_floats[3];
        iVar15 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        fVar27 = pbVar6[iVar15].m_axes[0].m_bottomVec.m_floats[2];
        uVar2 = *(undefined8 *)pbVar6[iVar15].m_axes[0].m_bottomVec.m_floats;
        uVar3 = *(undefined8 *)(pbVar6[iVar15].m_axes[0].m_bottomVec.m_floats + 1);
        fVar28 = (float)uVar2;
        fVar34 = (float)((ulong)uVar2 >> 0x20);
        fVar33 = q.super_btQuadWord.m_floats[0];
        fVar26 = (fVar25 * fVar34 + fVar24 * fVar28) - fVar33 * fVar27;
        fVar30 = q.super_btQuadWord.m_floats[1];
        fVar31 = (fVar27 * fVar25 + (float)uVar3 * fVar33) - fVar30 * fVar28;
        fVar32 = (fVar28 * fVar25 + (float)((ulong)uVar3 >> 0x20) * fVar30) - fVar24 * fVar34;
        fVar35 = -fVar30;
        fVar36 = -fVar24;
        fVar28 = fVar27 * fVar36 + (fVar34 * fVar35 - fVar28 * fVar33);
        fVar27 = (fVar26 * fVar33 + fVar32 * fVar35 + fVar28 * fVar36 + fVar31 * fVar25) * fVar23;
        fVar30 = fVar23 * (fVar30 * fVar31 + fVar36 * fVar26 + -fVar33 * fVar28 + fVar32 * fVar25);
        fVar23 = fVar23 * (fVar24 * fVar32 + -fVar33 * fVar31 + fVar35 * fVar28 + fVar26 * fVar25);
        auVar10._4_4_ = fVar23;
        auVar10._0_4_ = fVar30;
        auVar10._8_4_ = fVar27;
        auVar10._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = auVar10;
        auVar12._8_4_ = -fVar27;
        auVar12._0_8_ = CONCAT44(fVar23,fVar30) ^ 0x8000000080000000;
        auVar12._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar12;
        (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
        (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
        (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
      }
      else if (eVar5 == eRevolute) {
        (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
        (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
        (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
        btMatrix3x3::getRotation
                  (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                    [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform.m_basis,&q)
        ;
        fVar24 = q.super_btQuadWord.m_floats[2];
        fVar25 = q.super_btQuadWord.m_floats[3];
        iVar15 = (this->super_btMultiBodyConstraint).m_linkA;
        pbVar6 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
        fVar27 = pbVar6[iVar15].m_axes[0].m_topVec.m_floats[2];
        uVar2 = *(undefined8 *)pbVar6[iVar15].m_axes[0].m_topVec.m_floats;
        uVar3 = *(undefined8 *)(pbVar6[iVar15].m_axes[0].m_topVec.m_floats + 1);
        fVar28 = (float)uVar2;
        fVar34 = (float)((ulong)uVar2 >> 0x20);
        fVar33 = q.super_btQuadWord.m_floats[0];
        fVar26 = (fVar25 * fVar34 + fVar24 * fVar28) - fVar33 * fVar27;
        fVar30 = q.super_btQuadWord.m_floats[1];
        fVar31 = (fVar27 * fVar25 + (float)uVar3 * fVar33) - fVar30 * fVar28;
        fVar32 = (fVar28 * fVar25 + (float)((ulong)uVar3 >> 0x20) * fVar30) - fVar24 * fVar34;
        fVar35 = -fVar30;
        fVar36 = -fVar24;
        fVar28 = fVar27 * fVar36 + (fVar34 * fVar35 - fVar28 * fVar33);
        fVar27 = (fVar26 * fVar33 + fVar32 * fVar35 + fVar28 * fVar36 + fVar31 * fVar25) * fVar23;
        fVar30 = fVar23 * (fVar30 * fVar31 + fVar36 * fVar26 + -fVar33 * fVar28 + fVar32 * fVar25);
        fVar23 = fVar23 * (fVar24 * fVar32 + -fVar33 * fVar31 + fVar35 * fVar28 + fVar26 * fVar25);
        auVar9._4_4_ = fVar23;
        auVar9._0_4_ = fVar30;
        auVar9._8_4_ = fVar27;
        auVar9._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar9;
        auVar11._8_4_ = -fVar27;
        auVar11._0_8_ = CONCAT44(fVar23,fVar30) ^ 0x8000000080000000;
        auVar11._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar11;
      }
      pfVar14 = (this->super_btMultiBodyConstraint).m_data.m_data;
      fVar23 = pfVar14[(long)iVar20 + (long)(this->super_btMultiBodyConstraint).m_posOffset];
      bVar21 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0;
      pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
      bVar7 = fVar23 == *pbVar1;
      bVar8 = fVar23 < *pbVar1;
      if (fVar23 <= 0.0) {
        bVar22 = -bVar22;
        fVar23 = (-fVar23 *
                 (&(infoGlobal->super_btContactSolverInfoData).m_erp)[(bVar8 || bVar7) && bVar21]) /
                 (infoGlobal->super_btContactSolverInfoData).m_timeStep;
      }
      else {
        bVar22 = -fVar23 / (infoGlobal->super_btContactSolverInfoData).m_timeStep;
        fVar23 = 0.0;
      }
      fVar23 = fVar23 * solverConstraint->m_jacDiagABInv;
      bVar22 = bVar22 * solverConstraint->m_jacDiagABInv;
      if (!bVar8 && !bVar7 || !bVar21) {
        bVar22 = bVar22 + fVar23;
      }
      bVar29 = 0.0;
      if ((bVar8 || bVar7) && bVar21) {
        bVar29 = fVar23;
      }
      solverConstraint->m_rhs = bVar22;
      solverConstraint->m_rhsPenetration = bVar29;
      iVar20 = iVar20 + 1;
      iVar15 = (this->super_btMultiBodyConstraint).m_numRows;
    } while (iVar20 < iVar15);
  }
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
	
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.

	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}


    // row 0: the lower bound
    setPosition(0, m_bodyA->getJointPos(m_linkA) - m_lowerBound);			//multidof: this is joint-type dependent

    // row 1: the upper bound
    setPosition(1, m_upperBound - m_bodyA->getJointPos(m_linkA));
	
	for (int row=0;row<getNumRows();row++)
	{
		
		btScalar direction = row? -1 : 1;

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        constraintRow.m_orgConstraint = this;
        constraintRow.m_orgDofIndex = row;
        
		constraintRow.m_multiBodyA = m_bodyA;
		constraintRow.m_multiBodyB = m_bodyB;
		const btScalar posError = 0;						//why assume it's zero?
		const btVector3 dummy(0, 0, 0);

		btScalar rel_vel = fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,0,m_maxAppliedImpulse);

		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = direction*quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = direction* quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

		{
			btScalar penetration = getPosition(row);
			btScalar positionalError = 0.f;
			btScalar	velocityError =  - rel_vel;// * damping;
			btScalar erp = infoGlobal.m_erp2;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				erp = infoGlobal.m_erp;
			}
			if (penetration>0)
			{
				positionalError = 0;
				velocityError = -penetration / infoGlobal.m_timeStep;
			} else
			{
				positionalError = -penetration * erp/infoGlobal.m_timeStep;
			}

			btScalar  penetrationImpulse = positionalError*constraintRow.m_jacDiagABInv;
			btScalar velocityImpulse = velocityError *constraintRow.m_jacDiagABInv;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				//combine position and velocity into rhs
				constraintRow.m_rhs = penetrationImpulse+velocityImpulse;
				constraintRow.m_rhsPenetration = 0.f;

			} else
			{
				//split position and velocity into rhs and m_rhsPenetration
				constraintRow.m_rhs = velocityImpulse;
				constraintRow.m_rhsPenetration = penetrationImpulse;
			}
		}
	}

}